

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_subgroup_op(CompilerHLSL *this,Instruction *i)

{
  Bitset *pBVar1;
  uint16_t uVar2;
  uint32_t result_id;
  bool bVar3;
  uint32_t uVar4;
  BaseType input_type;
  BaseType BVar5;
  CompilerError *this_00;
  uint32_t uVar6;
  uint32_t op1;
  char *pcVar7;
  string *psVar8;
  char (*in_R9) [2];
  char (*in_stack_ffffffffffffff18) [26];
  char (*in_stack_ffffffffffffff20) [2];
  uint32_t *ops;
  string local_d0;
  string right;
  string left;
  string local_70;
  anon_class_16_2_633b9ddf make_inclusive_Product;
  anon_class_16_2_633b9ddf make_inclusive_Sum;
  
  if ((this->hlsl_options).shader_model < 0x3c) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Wave ops requires SM 6.0 or higher.");
    goto LAB_00211c15;
  }
  ops = Compiler::stream((Compiler *)this,i);
  uVar2 = i->op;
  uVar6 = *ops;
  result_id = ops[1];
  uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,ops[2]);
  if (uVar4 != 3) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Only subgroup scope is supported.");
    goto LAB_00211c15;
  }
  make_inclusive_Product.ops = &ops;
  make_inclusive_Product.this = this;
  make_inclusive_Sum.this = this;
  make_inclusive_Sum.ops = make_inclusive_Product.ops;
  uVar4 = CompilerGLSL::get_integer_width_for_instruction(&this->super_CompilerGLSL,i);
  input_type = to_signed_basetype(uVar4);
  BVar5 = to_unsigned_basetype(uVar4);
  switch(uVar2) {
  case 0x14d:
    ::std::__cxx11::string::string((string *)&left,"WaveIsFirstLane()",(allocator *)&right);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,result_id,&left,true,false);
    goto LAB_00211a5a;
  case 0x14e:
    uVar4 = ops[3];
    pcVar7 = "WaveActiveAllTrue";
    break;
  case 0x14f:
    uVar4 = ops[3];
    pcVar7 = "WaveActiveAnyTrue";
    break;
  case 0x150:
    uVar4 = ops[3];
    pcVar7 = "WaveActiveAllEqual";
    break;
  case 0x151:
  case 0x159:
    uVar4 = ops[3];
    op1 = ops[4];
    pcVar7 = "WaveReadLaneAt";
    goto LAB_00210ffa;
  case 0x152:
    uVar4 = ops[3];
    pcVar7 = "WaveReadLaneFirst";
    break;
  case 0x153:
    uVar4 = ops[3];
    pcVar7 = "WaveActiveBallot";
    break;
  case 0x154:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot trivially implement InverseBallot in HLSL.");
    goto LAB_00211c15;
  case 0x155:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot trivially implement BallotBitExtract in HLSL.");
    goto LAB_00211c15;
  case 0x156:
    uVar4 = ops[3];
    bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[4]);
    if (uVar4 == 2) {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_(&right,&this->super_CompilerGLSL,ops[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,ops[4],true);
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                (&left,(spirv_cross *)0x38ae36,(char (*) [11])&right,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".x & gl_SubgroupLtMask.x) + countbits(",(char (*) [39])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".y & gl_SubgroupLtMask.y)",in_stack_ffffffffffffff18);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&right);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,ops[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,ops[4],true);
      psVar8 = &local_70;
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                (&right,(spirv_cross *)0x38ae36,(char (*) [11])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".z & gl_SubgroupLtMask.z) + countbits(",(char (*) [39])psVar8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".w & gl_SubgroupLtMask.w)",in_stack_ffffffffffffff18);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_d0);
      join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                (&local_d0,(spirv_cross *)&left,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39255f,
                 (char (*) [4])&right,psVar8);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,result_id,&local_d0,bVar3,false);
      ::std::__cxx11::string::~string((string *)&local_d0);
      pBVar1 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins;
      bVar3 = Bitset::get(pBVar1,0x1144);
      if (!bVar3) {
        Bitset::set(pBVar1,0x1144);
        Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
      }
    }
    else if (uVar4 == 1) {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_(&right,&this->super_CompilerGLSL,ops[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,ops[4],true);
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                (&left,(spirv_cross *)0x38ae36,(char (*) [11])&right,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".x & gl_SubgroupLeMask.x) + countbits(",(char (*) [39])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".y & gl_SubgroupLeMask.y)",in_stack_ffffffffffffff18);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&right);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,ops[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,ops[4],true);
      psVar8 = &local_70;
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                (&right,(spirv_cross *)0x38ae36,(char (*) [11])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".z & gl_SubgroupLeMask.z) + countbits(",(char (*) [39])psVar8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ".w & gl_SubgroupLeMask.w)",in_stack_ffffffffffffff18);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_d0);
      join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                (&local_d0,(spirv_cross *)&left,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39255f,
                 (char (*) [4])&right,psVar8);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,result_id,&local_d0,bVar3,false);
      ::std::__cxx11::string::~string((string *)&local_d0);
      pBVar1 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins;
      bVar3 = Bitset::get(pBVar1,0x1143);
      if (!bVar3) {
        Bitset::set(pBVar1,0x1143);
        Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
      }
    }
    else {
      if (uVar4 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid BitCount operation.");
        goto LAB_00211c15;
      }
      CompilerGLSL::to_enclosed_expression_abi_cxx11_(&right,&this->super_CompilerGLSL,ops[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,ops[4],true);
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[17],std::__cxx11::string,char_const(&)[4]>
                (&left,(spirv_cross *)0x38ae36,(char (*) [11])&right,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38ae30,
                 (char (*) [17])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38ae57,
                 (char (*) [4])in_stack_ffffffffffffff18);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&right);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,ops[4],true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,ops[4],true);
      psVar8 = &local_70;
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[17],std::__cxx11::string,char_const(&)[4]>
                (&right,(spirv_cross *)0x38ae36,(char (*) [11])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38ae71,
                 (char (*) [17])psVar8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38ae98,
                 (char (*) [4])in_stack_ffffffffffffff18);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_d0);
      join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                (&local_d0,(spirv_cross *)&left,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39255f,
                 (char (*) [4])&right,psVar8);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,result_id,&local_d0,bVar3,false);
      ::std::__cxx11::string::~string((string *)&local_d0);
      Compiler::inherit_expression_dependencies((Compiler *)this,result_id,ops[4]);
    }
    ::std::__cxx11::string::~string((string *)&right);
LAB_00211a5a:
    ::std::__cxx11::string::~string((string *)&left);
    goto LAB_00211bc3;
  case 0x157:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot trivially implement BallotFindLSB in HLSL.");
    goto LAB_00211c15;
  case 0x158:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot trivially implement BallotFindMSB in HLSL.");
    goto LAB_00211c15;
  case 0x15a:
    bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[3]);
    uVar6 = *ops;
    uVar4 = ops[1];
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&right,&this->super_CompilerGLSL,ops[3],true);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,ops[4],true)
    ;
    join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
              (&left,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&right,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39b375,
               (char (*) [3])"WaveGetLaneIndex() ^ ",(char (*) [22])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
               in_stack_ffffffffffffff20);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,uVar4,&left,bVar3,false);
    goto LAB_0021162c;
  case 0x15b:
    bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[3]);
    uVar6 = *ops;
    uVar4 = ops[1];
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&right,&this->super_CompilerGLSL,ops[3],true);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,ops[4],true)
    ;
    join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
              (&left,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&right,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39b375,
               (char (*) [3])"WaveGetLaneIndex() - ",(char (*) [22])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
               in_stack_ffffffffffffff20);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,uVar4,&left,bVar3,false);
    goto LAB_0021162c;
  case 0x15c:
    bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[3]);
    uVar6 = *ops;
    uVar4 = ops[1];
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&right,&this->super_CompilerGLSL,ops[3],true);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,ops[4],true)
    ;
    join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
              (&left,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&right,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39b375,
               (char (*) [3])"WaveGetLaneIndex() + ",(char (*) [22])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
               in_stack_ffffffffffffff20);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,uVar4,&left,bVar3,false);
LAB_0021162c:
    ::std::__cxx11::string::~string((string *)&left);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&right);
    uVar6 = ops[3];
    uVar4 = ops[1];
LAB_00211bbe:
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar4,uVar6);
    goto LAB_00211bc3;
  case 0x15d:
    switch(ops[3]) {
    case 0:
switchD_0021106c_caseD_0:
      uVar4 = ops[4];
      pcVar7 = "WaveActiveSum";
      break;
    case 1:
      bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[4]);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,ops[4],true);
      join<char_const(&)[14],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&right,(spirv_cross *)"WavePrefixSum",(char (*) [14])0x39e911,
                 (char (*) [2])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,in_R9
                );
      emit_subgroup_op::anon_class_16_2_633b9ddf::operator()(&left,&make_inclusive_Sum,&right);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,result_id,&left,bVar3,false);
LAB_00211b93:
      ::std::__cxx11::string::~string((string *)&left);
      ::std::__cxx11::string::~string((string *)&right);
      ::std::__cxx11::string::~string((string *)&local_d0);
      uVar6 = ops[4];
      uVar4 = result_id;
      goto LAB_00211bbe;
    case 2:
switchD_0021106c_caseD_2:
      uVar4 = ops[4];
      pcVar7 = "WavePrefixSum";
      break;
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      goto LAB_00211c15;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    break;
  case 0x15e:
    switch(ops[3]) {
    case 0:
      goto switchD_0021106c_caseD_0;
    case 1:
      bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[4]);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,ops[4],true);
      join<char_const(&)[14],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&right,(spirv_cross *)"WavePrefixSum",(char (*) [14])0x39e911,
                 (char (*) [2])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,in_R9
                );
      emit_subgroup_op::anon_class_16_2_633b9ddf::operator()(&left,&make_inclusive_Sum,&right);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,result_id,&left,bVar3,false);
      goto LAB_00211b93;
    case 2:
      goto switchD_0021106c_caseD_2;
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00211c15;
  case 0x15f:
    switch(ops[3]) {
    case 0:
switchD_002114c6_caseD_0:
      uVar4 = ops[4];
      pcVar7 = "WaveActiveProduct";
      break;
    case 1:
      bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[4]);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,ops[4],true);
      join<char_const(&)[18],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&right,(spirv_cross *)"WavePrefixProduct",(char (*) [18])0x39e911,
                 (char (*) [2])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,in_R9
                );
      emit_subgroup_op::anon_class_16_2_633b9ddf::operator()(&left,&make_inclusive_Product,&right);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,result_id,&left,bVar3,false);
      goto LAB_00211b93;
    case 2:
switchD_002114c6_caseD_2:
      uVar4 = ops[4];
      pcVar7 = "WavePrefixProduct";
      break;
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      goto LAB_00211c15;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    break;
  case 0x160:
    switch(ops[3]) {
    case 0:
      goto switchD_002114c6_caseD_0;
    case 1:
      bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[4]);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,ops[4],true);
      join<char_const(&)[18],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&right,(spirv_cross *)"WavePrefixProduct",(char (*) [18])0x39e911,
                 (char (*) [2])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,in_R9
                );
      emit_subgroup_op::anon_class_16_2_633b9ddf::operator()(&left,&make_inclusive_Product,&right);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar6,result_id,&left,bVar3,false);
      goto LAB_00211b93;
    case 2:
      goto switchD_002114c6_caseD_2;
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00211c15;
  case 0x161:
    if (ops[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveMin";
    goto LAB_0021174f;
  case 0x162:
    if (ops[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveMin";
    input_type = BVar5;
    goto LAB_0021174f;
  case 0x163:
    if (ops[3] != 0) {
      if (ops[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveMin";
    break;
  case 0x164:
    if (ops[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveMax";
    goto LAB_0021174f;
  case 0x165:
    if (ops[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveMax";
    input_type = BVar5;
    goto LAB_0021174f;
  case 0x166:
    if (ops[3] != 0) {
      if (ops[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveMax";
    break;
  case 0x167:
    if (ops[3] != 0) {
      if (ops[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveBitAnd";
    break;
  case 0x168:
    if (ops[3] != 0) {
      if (ops[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveBitOr";
    break;
  case 0x169:
    if (ops[3] != 0) {
      if (ops[3] == 3) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot trivially implement ClusteredReduce in HLSL.");
      }
      else {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
      }
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveBitXor";
    break;
  case 0x16a:
    if (ops[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveBitAnd";
    input_type = BVar5;
    goto LAB_0021174f;
  case 0x16b:
    if (ops[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveBitOr";
    input_type = BVar5;
    goto LAB_0021174f;
  case 0x16c:
    if (ops[3] != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00211c15;
    }
    uVar4 = ops[4];
    pcVar7 = "WaveActiveBitXor";
    input_type = BVar5;
LAB_0021174f:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,uVar6,result_id,uVar4,pcVar7,input_type,input_type);
    goto LAB_00211bc3;
  case 0x16d:
    uVar4 = ops[3];
    op1 = ops[4];
    pcVar7 = "QuadReadLaneAt";
LAB_00210ffa:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,uVar6,result_id,uVar4,op1,pcVar7);
    goto LAB_00211bc3;
  case 0x16e:
    uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,ops[4]);
    if (uVar4 == 2) {
      uVar4 = ops[3];
      pcVar7 = "QuadReadAcrossDiagonal";
    }
    else if (uVar4 == 1) {
      uVar4 = ops[3];
      pcVar7 = "QuadReadAcrossY";
    }
    else {
      if (uVar4 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid quad swap direction.");
        goto LAB_00211c15;
      }
      uVar4 = ops[3];
      pcVar7 = "QuadReadAcrossX";
    }
    break;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
LAB_00211c15:
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,uVar6,result_id,uVar4,pcVar7);
LAB_00211bc3:
  CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,result_id);
  return;
}

Assistant:

void CompilerHLSL::emit_subgroup_op(const Instruction &i)
{
	if (hlsl_options.shader_model < 60)
		SPIRV_CROSS_THROW("Wave ops requires SM 6.0 or higher.");

	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	const auto make_inclusive_Sum = [&](const string &expr) -> string {
		return join(expr, " + ", to_expression(ops[4]));
	};

	const auto make_inclusive_Product = [&](const string &expr) -> string {
		return join(expr, " * ", to_expression(ops[4]));
	};

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

#define make_inclusive_BitAnd(expr) ""
#define make_inclusive_BitOr(expr) ""
#define make_inclusive_BitXor(expr) ""
#define make_inclusive_Min(expr) ""
#define make_inclusive_Max(expr) ""

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "WaveIsFirstLane()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "WaveReadLaneAt");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "WaveReadLaneFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		SPIRV_CROSS_THROW("Cannot trivially implement InverseBallot in HLSL.");

	case OpGroupNonUniformBallotBitExtract:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotBitExtract in HLSL.");

	case OpGroupNonUniformBallotFindLSB:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotFindLSB in HLSL.");

	case OpGroupNonUniformBallotFindMSB:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotFindMSB in HLSL.");

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		bool forward = should_forward(ops[4]);
		if (operation == GroupOperationReduce)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			inherit_expression_dependencies(id, ops[4]);
		}
		else if (operation == GroupOperationInclusiveScan)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x & gl_SubgroupLeMask.x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y & gl_SubgroupLeMask.y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z & gl_SubgroupLeMask.z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w & gl_SubgroupLeMask.w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			if (!active_input_builtins.get(BuiltInSubgroupLeMask))
			{
				active_input_builtins.set(BuiltInSubgroupLeMask);
				force_recompile_guarantee_forward_progress();
			}
		}
		else if (operation == GroupOperationExclusiveScan)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x & gl_SubgroupLtMask.x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y & gl_SubgroupLtMask.y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z & gl_SubgroupLtMask.z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w & gl_SubgroupLtMask.w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			if (!active_input_builtins.get(BuiltInSubgroupLtMask))
			{
				active_input_builtins.set(BuiltInSubgroupLtMask);
				force_recompile_guarantee_forward_progress();
			}
		}
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "WaveReadLaneAt");
		break;
	case OpGroupNonUniformShuffleXor:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() ^ ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}
	case OpGroupNonUniformShuffleUp:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() - ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}
	case OpGroupNonUniformShuffleDown:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() + ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAllTrue");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAnyTrue");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAllEqual");
		break;

	// clang-format off
#define HLSL_GROUP_OP(op, hlsl_op, supports_scan) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "WaveActive" #hlsl_op); \
		else if (operation == GroupOperationInclusiveScan && supports_scan) \
        { \
			bool forward = should_forward(ops[4]); \
			emit_op(result_type, id, make_inclusive_##hlsl_op (join("WavePrefix" #hlsl_op, "(", to_expression(ops[4]), ")")), forward); \
			inherit_expression_dependencies(id, ops[4]); \
        } \
		else if (operation == GroupOperationExclusiveScan && supports_scan) \
			emit_unary_func_op(result_type, id, ops[4], "WavePrefix" #hlsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			SPIRV_CROSS_THROW("Cannot trivially implement ClusteredReduce in HLSL."); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define HLSL_GROUP_OP_CAST(op, hlsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "WaveActive" #hlsl_op, type, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	HLSL_GROUP_OP(FAdd, Sum, true)
	HLSL_GROUP_OP(FMul, Product, true)
	HLSL_GROUP_OP(FMin, Min, false)
	HLSL_GROUP_OP(FMax, Max, false)
	HLSL_GROUP_OP(IAdd, Sum, true)
	HLSL_GROUP_OP(IMul, Product, true)
	HLSL_GROUP_OP_CAST(SMin, Min, int_type)
	HLSL_GROUP_OP_CAST(SMax, Max, int_type)
	HLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	HLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	HLSL_GROUP_OP(BitwiseAnd, BitAnd, false)
	HLSL_GROUP_OP(BitwiseOr, BitOr, false)
	HLSL_GROUP_OP(BitwiseXor, BitXor, false)
	HLSL_GROUP_OP_CAST(LogicalAnd, BitAnd, uint_type)
	HLSL_GROUP_OP_CAST(LogicalOr, BitOr, uint_type)
	HLSL_GROUP_OP_CAST(LogicalXor, BitXor, uint_type)

#undef HLSL_GROUP_OP
#undef HLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossX");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossY");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "QuadReadLaneAt");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}